

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O0

bool boost::ext::ut::v1_1_8::utility::is_match(string_view input,string_view pattern)

{
  char cVar1;
  string_view input_00;
  char *pcVar2;
  bool bVar3;
  const_reference pvVar4;
  size_type sVar5;
  basic_string_view<char,_std::char_traits<char>_> bVar6;
  basic_string_view<char,_std::char_traits<char>_> bVar7;
  bool local_99;
  ulong local_58;
  size_type i;
  undefined1 local_30 [8];
  string_view pattern_local;
  string_view input_local;
  
  pattern_local._M_len = (size_t)pattern._M_str;
  local_30 = (undefined1  [8])pattern._M_len;
  pattern_local._M_str = (char *)input._M_len;
  bVar3 = std::empty<std::basic_string_view<char,std::char_traits<char>>>
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
  if (bVar3) {
    input_local._M_str._7_1_ =
         std::empty<std::basic_string_view<char,std::char_traits<char>>>
                   ((basic_string_view<char,_std::char_traits<char>_> *)&pattern_local._M_str);
  }
  else {
    bVar3 = std::empty<std::basic_string_view<char,std::char_traits<char>>>
                      ((basic_string_view<char,_std::char_traits<char>_> *)&pattern_local._M_str);
    if (bVar3) {
      pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)local_30,0);
      pcVar2 = pattern_local._M_str;
      if (*pvVar4 == '*') {
        bVar6 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                          ((basic_string_view<char,_std::char_traits<char>_> *)local_30,1,
                           0xffffffffffffffff);
        input_00._M_str = input._M_str;
        input_00._M_len = (size_t)pcVar2;
        local_99 = is_match(input_00,bVar6);
      }
      else {
        local_99 = false;
      }
      input_local._M_str._7_1_ = local_99;
    }
    else {
      pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)local_30,0);
      if ((*pvVar4 != '?') &&
         (pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                             ((basic_string_view<char,_std::char_traits<char>_> *)local_30,0),
         *pvVar4 != '*')) {
        pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)local_30,0);
        cVar1 = *pvVar4;
        pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)
                            &pattern_local._M_str,0);
        if (cVar1 != *pvVar4) {
          return false;
        }
      }
      pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)local_30,0);
      if (*pvVar4 == '*') {
        for (local_58 = 0;
            sVar5 = std::size<std::basic_string_view<char,std::char_traits<char>>>
                              ((basic_string_view<char,_std::char_traits<char>_> *)
                               &pattern_local._M_str), local_58 <= sVar5; local_58 = local_58 + 1) {
          bVar6 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                            ((basic_string_view<char,_std::char_traits<char>_> *)
                             &pattern_local._M_str,local_58,0xffffffffffffffff);
          bVar7 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                            ((basic_string_view<char,_std::char_traits<char>_> *)local_30,1,
                             0xffffffffffffffff);
          bVar3 = is_match(bVar6,bVar7);
          if (bVar3) {
            return true;
          }
        }
        input_local._M_str._7_1_ = false;
      }
      else {
        bVar6 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                          ((basic_string_view<char,_std::char_traits<char>_> *)&pattern_local._M_str
                           ,1,0xffffffffffffffff);
        bVar7 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                          ((basic_string_view<char,_std::char_traits<char>_> *)local_30,1,
                           0xffffffffffffffff);
        input_local._M_str._7_1_ = is_match(bVar6,bVar7);
      }
    }
  }
  return input_local._M_str._7_1_;
}

Assistant:

[[nodiscard]] inline auto is_match(std::string_view input,
                                     std::string_view pattern) -> bool {
    if (std::empty(pattern)) {
      return std::empty(input);
    }

    if (std::empty(input)) {
      return pattern[0] == '*' ? is_match(input, pattern.substr(1)) : false;
    }

    if (pattern[0] != '?' and pattern[0] != '*' and pattern[0] != input[0]) {
      return false;
    }

    if (pattern[0] == '*') {
      for (decltype(std::size(input)) i = 0u; i <= std::size(input); ++i) {
        if (is_match(input.substr(i), pattern.substr(1))) {
          return true;
        }
      }
      return false;
    }

    return is_match(input.substr(1), pattern.substr(1));
  }